

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
lightconf::value_type_info<std::vector<int,_std::allocator<int>_>_>::extract_value
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,value *val)

{
  pointer pvVar1;
  return_type<int> rVar2;
  undefined8 in_RAX;
  return_type<std::vector<lightconf::value>_> pvVar3;
  value *u;
  pointer this;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_28 = in_RAX;
  pvVar3 = value::get<std::vector<lightconf::value,std::allocator<lightconf::value>>>(val);
  pvVar1 = (pvVar3->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (this = (pvVar3->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
              _M_impl.super__Vector_impl_data._M_start; this != pvVar1; this = this + 1) {
    rVar2 = value::get<int>(this);
    uStack_28 = CONCAT44(rVar2,(undefined4)uStack_28);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (__return_storage_ptr__,(int *)((long)&uStack_28 + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<U> extract_value(const value& val) {
        std::vector<U> v;
        const value_vector_type& inner_vals = val.get<value_vector_type>();
        for (const auto& u : inner_vals) {
            v.push_back(u.get<U>());
        }
        return v;
    }